

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall
RegisterParserTestDuplicateRuleInDifferentSubninjas::
RegisterParserTestDuplicateRuleInDifferentSubninjas
          (RegisterParserTestDuplicateRuleInDifferentSubninjas *this)

{
  RegisterTest(ParserTestDuplicateRuleInDifferentSubninjas::Create,
               "ParserTest.DuplicateRuleInDifferentSubninjas");
  return;
}

Assistant:

TEST_F(ParserTest, DuplicateRuleInDifferentSubninjas) {
  // Test that rules are scoped to subninjas.
  fs_.Create("test.ninja", "rule cat\n"
                         "  command = cat\n");
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_TRUE(parser.ParseTest("rule cat\n"
                                "  command = cat\n"
                                "subninja test.ninja\n", &err));
}